

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-stream.c
# Opt level: O0

hd_stream *
pdf_open_raw_filter(hd_context *ctx,hd_stream *chain,pdf_document *doc,pdf_obj *stmobj,int num,
                   int *orig_num,int *orig_gen,hd_off_t offset)

{
  int *piVar1;
  int iVar2;
  pdf_xref_entry *ppVar3;
  hd_stream *phVar4;
  pdf_obj *obj;
  int len;
  hd_stream *chain2;
  pdf_xref_entry *x;
  int *orig_num_local;
  int num_local;
  pdf_obj *stmobj_local;
  pdf_document *doc_local;
  hd_stream *chain_local;
  hd_context *ctx_local;
  
  doc_local = (pdf_document *)chain;
  chain_local = (hd_stream *)ctx;
  if ((num < 1) || (iVar2 = pdf_xref_len(ctx,doc), iVar2 <= num)) {
    *orig_num = num;
    *orig_gen = 0;
  }
  else {
    ppVar3 = pdf_get_xref_entry((hd_context *)chain_local,doc,num);
    *orig_num = ppVar3->num;
    *orig_gen = (uint)ppVar3->gen;
    if (ppVar3->stm_buf != (hd_buffer *)0x0) {
      phVar4 = hd_open_buffer((hd_context *)chain_local,ppVar3->stm_buf);
      return phVar4;
    }
  }
  hd_var_imp(&doc_local);
  iVar2 = hd_push_try((hd_context *)chain_local);
  if ((iVar2 != 0) &&
     (iVar2 = __sigsetjmp(**(long **)&chain_local->avail + 8,0), phVar4 = chain_local, iVar2 == 0))
  {
    obj = pdf_dict_get((hd_context *)chain_local,stmobj,(pdf_obj *)0xda);
    iVar2 = pdf_to_int((hd_context *)phVar4,obj);
    phVar4 = hd_keep_stream((hd_context *)chain_local,(hd_stream *)doc_local);
    doc_local = (pdf_document *)0x0;
    doc_local = (pdf_document *)hd_open_null((hd_context *)chain_local,phVar4,iVar2,offset);
  }
  piVar1 = (int *)**(undefined8 **)&chain_local->avail;
  **(undefined8 **)&chain_local->avail = piVar1 + -0x34;
  if (*piVar1 < 2) {
    return (hd_stream *)doc_local;
  }
  hd_drop_stream((hd_context *)chain_local,(hd_stream *)doc_local);
  hd_rethrow((hd_context *)chain_local);
}

Assistant:

static hd_stream *
pdf_open_raw_filter(hd_context *ctx, hd_stream *chain, pdf_document *doc, pdf_obj *stmobj, int num, int *orig_num, int *orig_gen, hd_off_t offset)
{
    pdf_xref_entry *x = NULL;
    hd_stream *chain2;
    int len;

    if (num > 0 && num < pdf_xref_len(ctx, doc))
    {
        x = pdf_get_xref_entry(ctx, doc, num);
        *orig_num = x->num;
        *orig_gen = x->gen;
        if (x->stm_buf)
            return hd_open_buffer(ctx, x->stm_buf);
    }
    else
    {
        /* We only end up here when called from pdf_open_stream_with_offset to parse new format XRef sections. */
        /* New style XRef sections must have generation number 0. */
        *orig_num = num;
        *orig_gen = 0;
    }

    hd_var(chain);

    hd_try(ctx)
    {
        len = pdf_to_int(ctx, pdf_dict_get(ctx, stmobj, PDF_NAME_Length));

        /* don't close chain when we close this filter */
        chain2 = hd_keep_stream(ctx, chain);
        chain = NULL;
        chain = hd_open_null(ctx, chain2, len, offset);

    }
    hd_catch(ctx)
    {
        hd_drop_stream(ctx, chain);
        hd_rethrow(ctx);
    }

    return chain;
}